

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M2Data.cpp
# Opt level: O1

bool __thiscall M2Data::parse_file_name(M2Data *this,char *monthly_csv_file_name)

{
  char *pcVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  char **ppcVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  ulong local_60;
  
  sVar6 = strlen(monthly_csv_file_name);
  if (sVar6 < 4) {
    lVar11 = 0;
    iVar4 = 0;
    uVar13 = 0;
    bVar16 = false;
  }
  else {
    ppcVar12 = file_suffix;
    local_60 = 0;
    lVar11 = 0;
    do {
      pcVar1 = *ppcVar12;
      sVar7 = strlen(pcVar1);
      if ((sVar7 < sVar6) &&
         (iVar4 = strcmp(monthly_csv_file_name + (sVar6 - sVar7),pcVar1), iVar4 == 0)) {
        this->M2Type = *(M2DataType *)((long)file_type + lVar11);
        bVar16 = true;
        local_60 = sVar7 & 0xffffffff;
      }
      else {
        bVar16 = false;
      }
      if (bVar16) break;
      ppcVar12 = ppcVar12 + 1;
      bVar16 = lVar11 != 8;
      lVar11 = lVar11 + 4;
    } while (bVar16);
    bVar17 = this->M2Type == UnknownM2Type;
    bVar16 = !bVar17;
    if (bVar17) {
      iVar4 = 0;
      uVar13 = 0;
    }
    else {
      iVar4 = 0;
      uVar10 = 0;
      do {
        uVar13 = uVar10 + 1;
        iVar14 = ((byte)monthly_csv_file_name[uVar10] - 0x30) + iVar4 * 10;
        if ((byte)(monthly_csv_file_name[uVar10] - 0x3aU) < 0xf6) {
          iVar14 = iVar4;
          bVar16 = false;
        }
        iVar4 = iVar14;
      } while ((bVar16) && (uVar9 = (uint)uVar10, uVar10 = uVar13, uVar9 < 3));
    }
    if (iVar4 - 0x80aU < 0xffffffd7) {
      bVar16 = false;
    }
    lVar11 = (long)(int)local_60;
  }
  if ((bVar16) && (pcVar1 = monthly_csv_file_name + uVar13, uVar13 = uVar13 + 1, *pcVar1 != '-')) {
    bVar16 = false;
  }
  if (bVar16) {
    if (this->M2Type == TLD_old) {
      iVar14 = 1;
      iVar15 = 0;
      lVar8 = 0;
      uVar10 = uVar13;
      do {
        pcVar1 = *(char **)((long)month_names + lVar8);
        sVar7 = strlen(pcVar1);
        uVar13 = sVar7 + uVar10;
        if ((uVar13 < sVar6) &&
           (iVar5 = strncmp(monthly_csv_file_name + uVar10,pcVar1,sVar7), iVar5 == 0)) {
          bVar17 = true;
          iVar15 = iVar14;
        }
        else {
          bVar17 = false;
          uVar13 = uVar10;
        }
        if (bVar17) break;
        iVar14 = iVar14 + 1;
        bVar17 = lVar8 != 0x58;
        lVar8 = lVar8 + 8;
        uVar10 = uVar13;
      } while (bVar17);
      if (iVar15 < 1) {
        iVar14 = 0;
        bVar16 = false;
      }
      else {
        iVar14 = month_day[iVar15 - 1];
      }
    }
    else {
      if (bVar16) {
        iVar14 = 0;
        iVar15 = 0;
        do {
          pbVar2 = (byte *)(monthly_csv_file_name + uVar13);
          uVar13 = uVar13 + 1;
          iVar5 = (*pbVar2 - 0x30) + iVar15 * 10;
          if ((byte)(*pbVar2 - 0x3a) < 0xf6) {
            bVar16 = false;
            iVar5 = iVar15;
          }
          iVar15 = iVar5;
          bVar17 = iVar14 == 0;
          iVar14 = iVar14 + -1;
        } while ((bVar16) && (bVar17));
      }
      else {
        iVar15 = 0;
      }
      if (iVar15 - 0xdU < 0xfffffff4) {
        bVar16 = false;
      }
      if (bVar16) {
        pcVar1 = monthly_csv_file_name + uVar13;
        uVar13 = uVar13 + 1;
        if (*pcVar1 != '-') {
          bVar16 = false;
        }
      }
      if (bVar16) {
        iVar5 = 0;
        iVar14 = 0;
        do {
          pbVar2 = (byte *)(monthly_csv_file_name + uVar13);
          uVar13 = uVar13 + 1;
          iVar3 = (*pbVar2 - 0x30) + iVar14 * 10;
          if ((byte)(*pbVar2 - 0x3a) < 0xf6) {
            bVar16 = false;
            iVar3 = iVar14;
          }
          iVar14 = iVar3;
          bVar17 = iVar5 == 0;
          iVar5 = iVar5 + -1;
        } while ((bVar16) && (bVar17));
      }
      else {
        iVar14 = 0;
        bVar16 = false;
      }
      if (iVar14 - 0x20U < 0xffffffe1) {
        bVar16 = false;
      }
    }
  }
  else {
    iVar14 = 0;
    iVar15 = 0;
  }
  bVar17 = false;
  if (uVar13 + lVar11 == sVar6) {
    bVar17 = bVar16;
  }
  if (bVar16 == false) {
    bVar17 = bVar16;
  }
  if (bVar17) {
    this->year = iVar4;
    this->month = iVar15;
    this->day = iVar14;
  }
  return bVar17;
}

Assistant:

bool M2Data::parse_file_name(char const * monthly_csv_file_name)
{
    bool ret = true;
    size_t len = strlen(monthly_csv_file_name);
    size_t char_index = 0;
    int y = 0;
    int m = 0;
    int d = 0;
    int suffix_len = 0;

    if (len < 4)
    {
        ret = false;
    }
    else
    {
        for (int i = 0; i < 3; i++)
        {
            size_t sl = strlen(file_suffix[i]);
            if (sl < len && strcmp(monthly_csv_file_name + len - sl, file_suffix[i]) == 0)
            {
                M2Type = file_type[i];
                suffix_len = (int) sl;
                break;
            }
        }

        if (M2Type == UnknownM2Type)
        {
            ret = false;
        }

        for (int i = 0; ret && i < 4; i++)
        {
            char c = monthly_csv_file_name[char_index++];

            if (c < '0' || c > '9')
            {
                ret = false;
            }
            else
            {
                y *= 10;
                y += c - '0';
            }
        }

        if (y < 2017 || y > 2057)
        {
            ret = false;
        }
    }

    if (ret && monthly_csv_file_name[char_index++] != '-')
    {
        ret = false;
    }

    if (ret)
    {
        if (M2Type == TLD_old)
        {
            for (int i = 0; i < 12; i++)
            {
                size_t ml = strlen(month_names[i]);
                if ((char_index + ml) < len &&
                    strncmp(&monthly_csv_file_name[char_index], month_names[i], ml) == 0)
                {
                    m = i+1;
                    char_index += ml;
                    break;
                }
            }


            if (m <= 0)
            {
                ret = false;
            }
            else
            {
                d = month_day[m-1];
            }
        }
        else
        {
            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    m *= 10;
                    m += c - '0';
                }
            }

            if (m <= 0 || m > 12)
            {
                ret = false;
            }

            if (ret && monthly_csv_file_name[char_index++] != '-')
            {
                ret = false;
            }

            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    d *= 10;
                    d += c - '0';
                }
            }

            if (d <= 0 || d > 31)
            {
                ret = false;
            }
        }
    }

    if (ret && char_index+suffix_len != len)
    {
        ret = false;
    }

    if (ret)
    {
        year = y;
        month = m;
        day = d;
    }

    return ret;
}